

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall
fragment_buffer_variant::fragment_buffer_variant
          (fragment_buffer_variant *this,string *_raw_text,int64_t _offset,int64_t _length)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = 1;
  in_RDI[1] = 0xffffffff;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  *(undefined8 *)(in_RDI + 10) = in_RSI;
  *(long *)(in_RDI + 0xc) = in_RDX;
  *(long *)(in_RDI + 0xe) = in_RCX;
  if (in_RDX < 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
               ,0x4be,"GGML_ASSERT(%s) failed","_offset >= 0");
  }
  if (in_RCX < 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
               ,0x4bf,"GGML_ASSERT(%s) failed","_length >= 1");
  }
  lVar1 = *(long *)(in_RDI + 0xc);
  lVar2 = *(long *)(in_RDI + 0xe);
  uVar3 = std::__cxx11::string::length();
  if (uVar3 < (ulong)(lVar1 + lVar2)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
               ,0x4c0,"GGML_ASSERT(%s) failed","offset + length <= raw_text.length()");
  }
  return;
}

Assistant:

fragment_buffer_variant(const std::string & _raw_text, int64_t _offset, int64_t _length)
    :
        type(FRAGMENT_BUFFER_VARIANT_TYPE_RAW_TEXT),
        token((llama_token) - 1),
        raw_text(_raw_text),
        offset(_offset),
        length(_length){
            GGML_ASSERT(_offset >= 0);
            GGML_ASSERT(_length >= 1);
            GGML_ASSERT(offset + length <= raw_text.length());
        }